

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_init_sc_decisions(AV1_PRIMARY *ppi)

{
  AV1_COMP *pAVar1;
  AV1_COMP *pAVar2;
  AV1_COMP *cur_cpi;
  int i;
  AV1_COMP *first_cpi;
  AV1_PRIMARY *ppi_local;
  
  pAVar1 = ppi->cpi;
  for (i = 1; i < ppi->num_fp_contexts; i = i + 1) {
    pAVar2 = ppi->parallel_cpi[i];
    (pAVar2->common).features.allow_screen_content_tools =
         (_Bool)((pAVar1->common).features.allow_screen_content_tools & 1);
    (pAVar2->common).features.allow_intrabc = (_Bool)((pAVar1->common).features.allow_intrabc & 1);
    pAVar2->use_screen_content_tools = pAVar1->use_screen_content_tools;
    pAVar2->is_screen_content_type = pAVar1->is_screen_content_type;
  }
  return;
}

Assistant:

void av1_init_sc_decisions(AV1_PRIMARY *const ppi) {
  AV1_COMP *const first_cpi = ppi->cpi;
  for (int i = 1; i < ppi->num_fp_contexts; ++i) {
    AV1_COMP *cur_cpi = ppi->parallel_cpi[i];
    cur_cpi->common.features.allow_screen_content_tools =
        first_cpi->common.features.allow_screen_content_tools;
    cur_cpi->common.features.allow_intrabc =
        first_cpi->common.features.allow_intrabc;
    cur_cpi->use_screen_content_tools = first_cpi->use_screen_content_tools;
    cur_cpi->is_screen_content_type = first_cpi->is_screen_content_type;
  }
}